

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderIsolines.cpp
# Opt level: O2

void __thiscall glcts::TessellationShadersIsolines::initTest(TessellationShadersIsolines *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  GLenum GVar5;
  undefined4 extraout_var;
  TessellationShaderUtils *this_00;
  mapped_type *this_01;
  NotSupportedError *this_02;
  long lVar6;
  _tessellation_shader_vertex_spacing_conflict vertex_spacing_mode;
  undefined8 local_88;
  float local_80;
  float local_7c;
  undefined1 local_78 [32];
  float local_58;
  _tessellation_shader_vertex_spacing_conflict local_54;
  long local_50;
  long local_48;
  long local_40;
  GLint gl_max_tess_gen_level_value;
  Functions *gl;
  
  iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar4);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported != false) {
    this_00 = (TessellationShaderUtils *)operator_new(0x20);
    TessellationShaderUtils::TessellationShaderUtils(this_00,gl,&this->super_TestCaseBase);
    this->m_utils_ptr = this_00;
    (*gl->genVertexArrays)(1,&this->m_vao_id);
    GVar5 = (*gl->getError)();
    glu::checkError(GVar5,"Could not generate vertex array object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                    ,0x22a);
    (*gl->bindVertexArray)(this->m_vao_id);
    GVar5 = (*gl->getError)();
    glu::checkError(GVar5,"Error binding vertex array object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                    ,0x22d);
    gl_max_tess_gen_level_value = 0;
    (*gl->getIntegerv)((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,
                       &gl_max_tess_gen_level_value);
    GVar5 = (*gl->getError)();
    glu::checkError(GVar5,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                    ,0x233);
    local_88 = 0x40800000bf800000;
    local_80 = (float)gl_max_tess_gen_level_value * 0.5;
    local_7c = (float)gl_max_tess_gen_level_value;
    this->m_irrelevant_tess_value_1 = -1.0;
    this->m_irrelevant_tess_value_2 = 4.0;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      fVar1 = *(float *)((long)&local_88 + lVar6 * 4);
      local_50 = lVar6;
      for (local_48 = 0; local_48 != 4; local_48 = local_48 + 1) {
        fVar2 = *(float *)((long)&local_88 + local_48 * 4);
        for (local_40 = 0; local_40 != 2; local_40 = local_40 + 1) {
          fVar3 = *(float *)((long)&local_88 + local_40 * 4);
          for (lVar6 = 0; lVar6 != 0xc; lVar6 = lVar6 + 4) {
            vertex_spacing_mode =
                 *(_tessellation_shader_vertex_spacing_conflict *)((long)&DAT_017b3b04 + lVar6);
            local_78._0_8_ = this;
            local_78._8_4_ = fVar3;
            local_78._12_4_ = fVar3;
            local_78._16_4_ = fVar3;
            local_78._20_4_ = fVar1;
            local_78._24_4_ = fVar2;
            local_78._28_4_ = fVar3;
            local_58 = fVar3;
            local_54 = vertex_spacing_mode;
            this_01 = std::
                      map<glcts::_tessellation_shader_vertex_spacing,_std::vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>,_std::less<glcts::_tessellation_shader_vertex_spacing>,_std::allocator<std::pair<const_glcts::_tessellation_shader_vertex_spacing,_std::vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>_>_>_>
                      ::operator[](&this->m_tests,&vertex_spacing_mode);
            std::
            vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>
            ::push_back(this_01,(value_type *)local_78);
          }
          lVar6 = local_50;
        }
      }
    }
    return;
  }
  this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"Tessellation shader functionality not supported, skipping",
             (allocator<char> *)&local_88);
  tcu::NotSupportedError::NotSupportedError(this_02,(string *)local_78);
  __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShadersIsolines::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Generate Utilities instance */
	m_utils_ptr = new TessellationShaderUtils(gl, this);

	/* Set up vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	glw::GLint gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Initialize reference tessellation values */
	const glw::GLfloat tess_levels[] = { -1.0f, 4.0f, float(gl_max_tess_gen_level_value) * 0.5f,
										 float(gl_max_tess_gen_level_value) };
	const unsigned int n_tess_levels = sizeof(tess_levels) / sizeof(tess_levels[0]);

	m_irrelevant_tess_value_1 = tess_levels[0];
	m_irrelevant_tess_value_2 = tess_levels[1];

	/* Initialize all test passes.
	 *
	 * Make sure each relevant outer tessellation level iterates through values
	 * of our interest
	 */
	for (unsigned int outer1_tess_level_index = 0; outer1_tess_level_index < n_tess_levels; ++outer1_tess_level_index)
	{
		for (unsigned int outer2_tess_level_index = 0; outer2_tess_level_index < n_tess_levels;
			 ++outer2_tess_level_index)
		{
			/* To make the test execute in a reasonable time frame, just use
			 * two different levels for the outer tessellation levels */
			DE_STATIC_ASSERT(n_tess_levels >= 2);

			for (unsigned int other_tess_level_index = 0; other_tess_level_index < 2 /* see comment */;
				 ++other_tess_level_index)
			{
				float inner_tess_levels[2] = { tess_levels[other_tess_level_index],
											   tess_levels[other_tess_level_index] };
				float outer_tess_levels[4] = { tess_levels[outer1_tess_level_index],
											   tess_levels[outer2_tess_level_index],
											   tess_levels[other_tess_level_index],
											   tess_levels[other_tess_level_index] };

				/* Finally, iterate over three vertex spacing modes */
				_tessellation_shader_vertex_spacing vertex_spacing_mode;

				const _tessellation_shader_vertex_spacing vs_modes[] = {
					TESSELLATION_SHADER_VERTEX_SPACING_EQUAL, TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN,
					TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD
				};
				const int n_vs_modes = sizeof(vs_modes) / sizeof(vs_modes[0]);

				for (int n_vs_mode = 0; n_vs_mode < n_vs_modes; ++n_vs_mode)
				{
					vertex_spacing_mode = vs_modes[n_vs_mode];

					_test_descriptor test;

					initTestDescriptor(vertex_spacing_mode, inner_tess_levels, outer_tess_levels,
									   tess_levels[other_tess_level_index], test);

					m_tests[vertex_spacing_mode].push_back(test);
				} /* for (all available vertex spacing modes) */
			}	 /* for (all irrelevant tessellation levels) */
		}		  /* for (all defined second outer tessellation levels) */
	}			  /* for (all defined first outer tessellation levels) */
}